

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cc
# Opt level: O2

bool verona::lookup_type(NodeRange *n,initializer_list<trieste::Token> t)

{
  bool bVar1;
  size_type in_RCX;
  initializer_list<trieste::Token> t_00;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  t_00._M_array = (iterator)t._M_len;
  ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,
             &((n->first)._M_current)->
              super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>);
  t_00._M_len = in_RCX;
  bVar1 = lookup_type((verona *)&_Stack_28,(Node *)t._M_array,t_00);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  return bVar1;
}

Assistant:

bool lookup_type(const NodeRange& n, std::initializer_list<Token> t)
  {
    return lookup_type(*n.first, t);
  }